

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomNormalDynamicLayerParams::SerializeWithCachedSizes
          (RandomNormalDynamicLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  
  if (this->seed_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->seed_,output);
  }
  fVar1 = this->mean_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar1,output);
  }
  fVar1 = this->stddev_;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar1,output);
  return;
}

Assistant:

void RandomNormalDynamicLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RandomNormalDynamicLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->seed() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->seed(), output);
  }

  // float mean = 2;
  if (this->mean() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->mean(), output);
  }

  // float stdDev = 3;
  if (this->stddev() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->stddev(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RandomNormalDynamicLayerParams)
}